

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O0

UInt32 crnlib::Bt3_MatchFinder_GetMatches(CMatchFinder *p,UInt32 *distances)

{
  uint lenLimit_00;
  UInt32 UVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  UInt32 UVar6;
  UInt32 *pUVar7;
  UInt32 temp;
  UInt32 curMatch;
  Byte *cur;
  UInt32 hashValue;
  UInt32 lenLimit;
  UInt32 offset;
  UInt32 maxLen;
  UInt32 delta2;
  UInt32 hash2Value;
  UInt32 *distances_local;
  CMatchFinder *p_local;
  
  lenLimit_00 = p->lenLimit;
  if (lenLimit_00 < 3) {
    MatchFinder_MovePos(p);
    p_local._4_4_ = 0;
  }
  else {
    pbVar2 = p->buffer;
    uVar3 = p->crc[*pbVar2] ^ (uint)pbVar2[1];
    uVar4 = uVar3 & 0x3ff;
    uVar3 = (uVar3 ^ (uint)pbVar2[2] << 8) & p->hashMask;
    uVar5 = p->pos - p->hash[uVar4];
    UVar6 = p->hash[uVar3 + 0x400];
    UVar1 = p->pos;
    p->hash[uVar3 + 0x400] = UVar1;
    p->hash[uVar4] = UVar1;
    lenLimit = 2;
    hashValue = 0;
    if ((uVar5 < p->cyclicBufferSize) && (pbVar2[-(ulong)uVar5] == *pbVar2)) {
      for (; (lenLimit != lenLimit_00 &&
             (pbVar2[(ulong)lenLimit - (ulong)uVar5] == pbVar2[lenLimit])); lenLimit = lenLimit + 1)
      {
      }
      *distances = lenLimit;
      distances[1] = uVar5 - 1;
      hashValue = 2;
      if (lenLimit == lenLimit_00) {
        SkipMatchesSpec(lenLimit_00,UVar6,p->pos,p->buffer,p->son,p->cyclicBufferPos,
                        p->cyclicBufferSize,p->cutValue);
        p->cyclicBufferPos = p->cyclicBufferPos + 1;
        p->buffer = p->buffer + 1;
        UVar6 = p->pos + 1;
        p->pos = UVar6;
        if (UVar6 == p->posLimit) {
          MatchFinder_CheckLimits(p);
        }
        return 2;
      }
    }
    pUVar7 = GetMatchesSpec1(lenLimit_00,UVar6,p->pos,p->buffer,p->son,p->cyclicBufferPos,
                             p->cyclicBufferSize,p->cutValue,distances + hashValue,lenLimit);
    p_local._4_4_ = (UInt32)((long)pUVar7 - (long)distances >> 2);
    p->cyclicBufferPos = p->cyclicBufferPos + 1;
    p->buffer = p->buffer + 1;
    UVar6 = p->pos + 1;
    p->pos = UVar6;
    if (UVar6 == p->posLimit) {
      MatchFinder_CheckLimits(p);
    }
  }
  return p_local._4_4_;
}

Assistant:

static UInt32 Bt3_MatchFinder_GetMatches(CMatchFinder* p, UInt32* distances) {
  UInt32 hash2Value, delta2, maxLen, offset;
  GET_MATCHES_HEADER(3)

  HASH3_CALC;

  delta2 = p->pos - p->hash[hash2Value];
  curMatch = p->hash[kFix3HashSize + hashValue];

  p->hash[hash2Value] =
      p->hash[kFix3HashSize + hashValue] = p->pos;

  maxLen = 2;
  offset = 0;
  if (delta2 < p->cyclicBufferSize && *(cur - delta2) == *cur) {
    for (; maxLen != lenLimit; maxLen++)
      if (cur[(ptrdiff_t)maxLen - delta2] != cur[maxLen])
        break;
    distances[0] = maxLen;
    distances[1] = delta2 - 1;
    offset = 2;
    if (maxLen == lenLimit) {
      SkipMatchesSpec(lenLimit, curMatch, MF_PARAMS(p));
      MOVE_POS_RET;
    }
  }
  GET_MATCHES_FOOTER(offset, maxLen)
}